

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_test_fixture.cpp
# Opt level: O0

void __thiscall
wallet::WalletTestingSetup::WalletTestingSetup(WalletTestingSetup *this,ChainType chainType)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CWallet *this_01;
  ArgsManager **__s;
  pointer pCVar2;
  pointer pWVar3;
  long in_RDI;
  long in_FS_OFFSET;
  TestOpts *in_stack_fffffffffffffec8;
  unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
  *in_stack_fffffffffffffed0;
  MockableData *in_stack_fffffffffffffed8;
  unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *this_02;
  ArgsManager *in_stack_fffffffffffffee0;
  Chain *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int line;
  char *in_stack_ffffffffffffff00;
  ArgsManager **in_stack_ffffffffffffff08;
  allocator<char> *__a;
  shared_ptr<interfaces::Chain::Notifications> local_a0;
  unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> local_90 [2];
  allocator<char> local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  TestOpts *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  ChainType in_stack_ffffffffffffffe4;
  TestingSetup *in_stack_ffffffffffffffe8;
  CWallet *in_stack_fffffffffffffff0;
  
  line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&in_stack_fffffffffffffec8->extra_args);
  local_60 = 1;
  local_5f = 1;
  local_5e = 1;
  local_5d = 1;
  local_5c = 0;
  TestingSetup::TestingSetup
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  TestOpts::~TestOpts(in_stack_fffffffffffffec8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x488);
  this_01 = (CWallet *)
            std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator*
                      ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                       in_stack_fffffffffffffed8);
  __s = inline_assertion_check<true,ArgsManager*&>
                  (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,line,
                   in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  interfaces::MakeWalletLoader(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffffec8);
  __a = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffffec8);
  CreateMockableWalletDatabase(in_stack_fffffffffffffed8);
  CWallet::CWallet(in_stack_fffffffffffffff0,(Chain *)in_stack_ffffffffffffffe8,
                   (string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)in_stack_ffffffffffffffd8);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffffed8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffffec8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  std::allocator<char>::~allocator(&local_79);
  std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>::
  unique_ptr<std::default_delete<interfaces::Handler>,void>
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             in_stack_fffffffffffffec8);
  CWallet::LoadWallet(this_01);
  pCVar2 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                     ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                      in_stack_fffffffffffffec8);
  std::shared_ptr<interfaces::Chain::Notifications>::
  shared_ptr<wallet::CWallet,wallet::WalletTestingSetup::WalletTestingSetup(ChainType)::__0,void>
            (&local_a0,in_RDI + 0x490);
  (*pCVar2->_vptr_Chain[0x29])(local_90,pCVar2,&local_a0);
  this_02 = local_90;
  std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::operator=
            (this_02,in_stack_fffffffffffffed0);
  std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::~unique_ptr
            (this_02);
  std::shared_ptr<interfaces::Chain::Notifications>::~shared_ptr
            ((shared_ptr<interfaces::Chain::Notifications> *)in_stack_fffffffffffffec8);
  pWVar3 = std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
           ::operator->((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                         *)in_stack_fffffffffffffec8);
  (*(pWVar3->super_ChainClient)._vptr_ChainClient[2])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

WalletTestingSetup::WalletTestingSetup(const ChainType chainType)
    : TestingSetup(chainType),
      m_wallet_loader{interfaces::MakeWalletLoader(*m_node.chain, *Assert(m_node.args))},
      m_wallet(m_node.chain.get(), "", CreateMockableWalletDatabase())
{
    m_wallet.LoadWallet();
    m_chain_notifications_handler = m_node.chain->handleNotifications({ &m_wallet, [](CWallet*) {} });
    m_wallet_loader->registerRpcs();
}